

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void play_speaker(tgestate_t *state,sound_t sound)

{
  uint in_ESI;
  long in_RDI;
  int i;
  uint8_t speakerbit;
  uint8_t delay;
  uint8_t iters;
  undefined4 local_14;
  undefined1 local_f;
  undefined1 local_d;
  
  local_d = (char)(in_ESI >> 8);
  local_f = 0x10;
  do {
    (**(code **)(*(long *)(in_RDI + 0x18) + 8))(*(undefined8 *)(in_RDI + 0x18),0xfe,local_f);
    for (local_14 = 0; local_14 < (int)(in_ESI & 0xff); local_14 = local_14 + 1) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 8))(*(undefined8 *)(in_RDI + 0x18),0xfe,local_f);
    }
    local_f = local_f ^ 0x10;
    local_d = local_d + -1;
  } while (local_d != '\0');
  return;
}

Assistant:

void play_speaker(tgestate_t *state, sound_t sound)
{
  uint8_t iters;      /* was B */
  uint8_t delay;      /* was A */
  uint8_t speakerbit; /* was A */
//  uint8_t subcount;   /* was C */

  assert(state != NULL);
  // assert(sound); somehow

  iters = sound >> 8;
  delay = sound & 0xFF;

  speakerbit = port_MASK_EAR; /* Initial speaker bit. */
  do
  {
    state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speakerbit); /* Play. */

    /* Conv: Timing: The original game uses an empty delay loop here to
     * maintain the currently output speaker bit. Instead of that, since our
     * sound code has no knowledge of time, we just output the speaker bit
     * for the delay period. */
    {
      int i;

      for (i = 0; i < delay; i++)
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speakerbit);;
    }

    speakerbit ^= port_MASK_EAR; /* Toggle speaker bit. */
  }
  while (--iters);
}